

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O0

string * minibag::Recorder::timeToStr<miniros::WallTime>(WallTime ros_t)

{
  allocator<char> *__a;
  tm *__tp;
  string *in_RDI;
  time_t time;
  char timeString [1024];
  allocator<char> local_421;
  char *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  
  __a = (allocator<char> *)::time((time_t *)0x0);
  __tp = gmtime((time_t *)&stack0xfffffffffffffbe0);
  strftime(&stack0xfffffffffffffbe8,0x400,"%Y-%m-%d-%H-%M-%S",__tp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,__a);
  std::allocator<char>::~allocator(&local_421);
  return in_RDI;
}

Assistant:

std::string Recorder::timeToStr(T ros_t)
{
  (void)ros_t;

  char timeString[1024];
  
  // Example of the very popular RFC 3339 format UTC time
  std::time_t time = std::time({});
  std::strftime(timeString, sizeof(timeString), "%Y-%m-%d-%H-%M-%S", std::gmtime(&time));
  
  return std::string(timeString);
}